

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_cargo_zero_start_one_option_no_args(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  cargo_t cargo;
  int b;
  char *args [1];
  cargo_t local_20;
  int local_14;
  char *local_10;
  
  iVar1 = cargo_init(&local_20,0,"program");
  if (iVar1 == 0) {
    local_14 = 0;
    local_10 = "--beta";
    iVar1 = cargo_add_option(local_20,0,"--beta",(char *)0x0,"i");
    if (iVar1 == 0) {
      uVar2 = cargo_parse(local_20,0,0,1,&local_10);
      printf("ret == %d\n",(ulong)uVar2);
      if (uVar2 == 0xfffffffc) {
        pcVar3 = (char *)0x0;
        if (local_14 != 0) {
          pcVar3 = "Expected b == 0";
        }
      }
      else {
        pcVar3 = "Parse should fail";
      }
    }
    else {
      pcVar3 = "Failed to add option";
    }
    cargo_destroy(&local_20);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_cargo_zero_start_one_option_no_args)
{
    int b = 0;
    char *args[] = { "--beta" };

    ret |= cargo_add_option(cargo, 0, "--beta", NULL, "i", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 0, sizeof(args) / sizeof(args[0]), args);
    printf("ret == %d\n", ret);
    cargo_assert(ret == CARGO_PARSE_MISS_REQUIRED, "Parse should fail");
    cargo_assert(b == 0, "Expected b == 0");

    _TEST_CLEANUP();
}